

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_54919::GetSourceiv
          (anon_unknown_dwarf_54919 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<int,_18446744073709551615UL> values)

{
  anon_unknown_dwarf_54919 aVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  runtime_error *prVar5;
  long *plVar6;
  SourceProp prop_00;
  undefined4 in_register_0000000c;
  uint *puVar7;
  long *plVar8;
  ALCcontext *Context_00;
  int iVar9;
  pointer piVar10;
  undefined8 uVar11;
  span<double,_18446744073709551615UL> values_00;
  span<double,_18446744073709551615UL> values_01;
  span<double,_18446744073709551615UL> values_02;
  double dvals [6];
  undefined1 local_78 [32];
  double local_58;
  double dStack_50;
  double local_48;
  string local_40;
  
  puVar7 = (uint *)CONCAT44(in_register_0000000c,prop);
  piVar10 = values.mData;
  iVar9 = (int)Context;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  prop_00 = (SourceProp)local_78;
  if (0x1211 < iVar9) {
    if (iVar9 < 0xd000) {
      if (iVar9 == 0x1212) {
        values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
        if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
          uVar4 = *(uint *)(this + 0x6c);
          goto LAB_0012657f;
        }
        Context_00 = (ALCcontext *)0x1212;
      }
      else {
        if (iVar9 != 0x1214) {
          if (iVar9 != 0xc000) goto switchD_00126546_caseD_1008;
          goto switchD_00126546_caseD_1001;
        }
        values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
        if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
          aVar1 = this[0x71];
          if (2 < (byte)aVar1) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_40,(uint)(byte)aVar1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,"Invalid SpatializeMode: ",&local_40);
            std::runtime_error::runtime_error(prVar5,(string *)local_78);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00126874;
        }
        Context_00 = (ALCcontext *)0x1214;
      }
    }
    else {
      switch(iVar9) {
      case 0x20007:
      case 0x20008:
      case 0x20009:
        goto switchD_00126546_caseD_1001;
      case 0x2000a:
        values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
        if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
          uVar4 = (uint)(byte)this[0x72];
          goto LAB_0012657f;
        }
        Context_00 = (ALCcontext *)0x2000a;
        break;
      case 0x2000b:
        values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
        if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
          uVar4 = (uint)(byte)this[0x73];
          goto LAB_0012657f;
        }
        Context_00 = (ALCcontext *)0x2000b;
        break;
      case 0x2000c:
        values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
        if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
          uVar4 = (uint)(byte)this[0x74];
          goto LAB_0012657f;
        }
        Context_00 = (ALCcontext *)0x2000c;
        break;
      default:
        if (iVar9 != 0xd000) goto switchD_00126546_caseD_1008;
        values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
        if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
          uVar4 = *(uint *)(this + 0x68);
          goto LAB_0012657f;
        }
        Context_00 = (ALCcontext *)0xd000;
      }
    }
    goto LAB_00126a5d;
  }
  switch(iVar9) {
  case 0x1001:
  case 0x1002:
  case 0x1003:
  case 0x100a:
  case 0x100d:
  case 0x100e:
  case 0x1020:
  case 0x1021:
  case 0x1022:
  case 0x1023:
  case 0x1024:
  case 0x1025:
  case 0x1026:
  case 0x1031:
switchD_00126546_caseD_1001:
    values_00.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_00.mDataEnd == (pointer)0x1) ||
       (values_01.mDataEnd = values_00.mDataEnd, values_00.mDataEnd == (pointer)0x6)) {
      values_00.mData = (pointer)(local_78 + 8);
      bVar3 = GetSourcedv(this,Source,Context_00,prop_00,values_00);
      if (!bVar3) {
        return false;
      }
      uVar4 = (uint)(double)local_78._0_8_;
LAB_0012657f:
      *puVar7 = uVar4;
      return true;
    }
    break;
  case 0x1004:
  case 0x1005:
  case 0x1006:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x3) || (values_01.mDataEnd == (pointer)0x6)) {
      values_01.mData = (pointer)(local_78 + 0x18);
      bVar3 = GetSourcedv(this,Source,Context_00,prop_00,values_01);
      if (!bVar3) {
        return false;
      }
      *(ulong *)puVar7 = CONCAT44((int)(double)local_78._8_8_,(int)(double)local_78._0_8_);
      puVar7[2] = (int)(double)local_78._16_8_;
      return true;
    }
    uVar11 = 3;
    goto LAB_001269ff;
  case 0x1007:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      uVar4 = (uint)(byte)this[0x65];
      goto LAB_0012657f;
    }
    Context_00 = (ALCcontext *)0x1007;
    break;
  case 0x1008:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1030:
  case 0x1032:
switchD_00126546_caseD_1008:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    ALCcontext::setError
              ((ALCcontext *)Source,0xa002,"Invalid source integer property 0x%04x",Context_00);
    return false;
  case 0x1009:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      uVar4 = 0;
      if ((*(int *)(this + 0x174) == 0x1028) &&
         ((*(long *)(this + 0x180) != 0 &&
          (lVar2 = *(long *)(*(long *)(this + 0x180) + 0x10), lVar2 != 0)))) {
        uVar4 = *(uint *)(lVar2 + 0x74);
      }
      goto LAB_0012657f;
    }
    Context_00 = (ALCcontext *)0x1009;
    break;
  case 0x100f:
    if ((long)piVar10 - (long)puVar7 == 0x18) {
      values_02.mDataEnd = (pointer)0x18;
      values_02.mData = &local_48;
      bVar3 = GetSourcedv(this,Source,(ALCcontext *)0x100f,prop_00,values_02);
      if (bVar3) {
        *puVar7 = (int)(double)local_78._0_8_;
        puVar7[1] = (int)(double)local_78._8_8_;
        puVar7[2] = (int)(double)local_78._16_8_;
        puVar7[3] = (int)(double)local_78._24_8_;
        *(ulong *)(puVar7 + 4) = CONCAT44((int)dStack_50,(int)local_58);
        return true;
      }
      return false;
    }
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    Context_00 = (ALCcontext *)0x100f;
    uVar11 = 6;
    goto LAB_001269ff;
  case 0x1010:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      if (((ulong)*(uint *)(this + 0x18c) < *(ulong *)&(Source->Send)._M_elems[5].LFReference) &&
         (*(int *)(*(long *)(*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                            (ulong)*(uint *)(this + 0x18c) * 8) + 0x170) == *(int *)(this + 400))) {
        uVar4 = *(uint *)(this + 0x178);
      }
      else {
        *(undefined4 *)(this + 0x18c) = 0xffffffff;
        uVar4 = *(uint *)(this + 0x178);
        if (uVar4 == 0x1012) {
          *(undefined4 *)(this + 0x178) = 0x1014;
          uVar4 = 0x1014;
        }
      }
      goto LAB_0012657f;
    }
    Context_00 = (ALCcontext *)0x1010;
    break;
  case 0x1015:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      plVar6 = *(long **)(this + 0x180);
      if (plVar6 != (long *)0x0) {
        uVar4 = 0;
        do {
          uVar4 = uVar4 + 1;
          plVar6 = (long *)*plVar6;
        } while (plVar6 != (long *)0x0);
        *puVar7 = uVar4;
        return true;
      }
LAB_001268eb:
      *puVar7 = 0;
      return true;
    }
    Context_00 = (ALCcontext *)0x1015;
    break;
  case 0x1016:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      if ((this[0x65] == (anon_unknown_dwarf_54919)0x0) && (*(int *)(this + 0x174) == 0x1029)) {
        plVar6 = *(long **)(this + 0x180);
        if (((ulong)*(uint *)(this + 0x18c) < *(ulong *)&(Source->Send)._M_elems[5].LFReference) &&
           (lVar2 = *(long *)(*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                             (ulong)*(uint *)(this + 0x18c) * 8),
           *(int *)(lVar2 + 0x170) == *(int *)(this + 400))) {
          plVar8 = *(long **)(lVar2 + 0x188);
        }
        else {
          *(undefined4 *)(this + 0x18c) = 0xffffffff;
          plVar8 = (long *)0x0;
          if (*(int *)(this + 0x178) == 0x1011) {
            plVar8 = plVar6;
          }
        }
        uVar4 = 0;
        if ((plVar6 != (long *)0x0) && (uVar4 = 0, plVar6 != plVar8)) {
          uVar4 = 0;
          do {
            uVar4 = uVar4 + 1;
            plVar6 = (long *)*plVar6;
            if (plVar6 == (long *)0x0) break;
          } while (plVar8 != plVar6);
        }
        *puVar7 = uVar4;
        return true;
      }
      goto LAB_001268eb;
    }
    Context_00 = (ALCcontext *)0x1016;
    break;
  case 0x1027:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      uVar4 = *(uint *)(this + 0x174);
      goto LAB_0012657f;
    }
    Context_00 = (ALCcontext *)0x1027;
    break;
  case 0x1033:
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      aVar1 = this[0x70];
      if (2 < (byte)aVar1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_40,(uint)(byte)aVar1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,"Invalid DirectMode: ",&local_40);
        std::runtime_error::runtime_error(prVar5,(string *)local_78);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00126874:
      *puVar7 = (uint)(byte)aVar1;
      return true;
    }
    Context_00 = (ALCcontext *)0x1033;
    break;
  default:
    if (iVar9 != 0x202) goto switchD_00126546_caseD_1008;
    values_01.mDataEnd = (pointer)((long)piVar10 - (long)puVar7 >> 2);
    if ((values_01.mDataEnd == (pointer)0x1) || (values_01.mDataEnd == (pointer)0x6)) {
      uVar4 = (uint)(byte)this[100];
      goto LAB_0012657f;
    }
    Context_00 = (ALCcontext *)0x202;
  }
LAB_00126a5d:
  uVar11 = 1;
LAB_001269ff:
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             uVar11,values_01.mDataEnd);
  return false;
}

Assistant:

bool GetSourceiv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<int> values)
{
    double dvals[MaxValues];
    bool err;

    switch(prop)
    {
    case AL_SOURCE_RELATIVE:
        CHECKSIZE(values, 1);
        values[0] = Source->HeadRelative;
        return true;

    case AL_LOOPING:
        CHECKSIZE(values, 1);
        values[0] = Source->Looping;
        return true;

    case AL_BUFFER:
        CHECKSIZE(values, 1);
        {
            BufferlistItem *BufferList{nullptr};
            if(Source->SourceType == AL_STATIC) BufferList = Source->queue;
            BufferStorage *buffer{nullptr};
            if(BufferList) buffer = BufferList->mBuffer;
            values[0] = buffer ? static_cast<int>(BufferFromStorage(buffer)->id) : 0;
        }
        return true;

    case AL_SOURCE_STATE:
        CHECKSIZE(values, 1);
        values[0] = GetSourceState(Source, GetSourceVoice(Source, Context));
        return true;

    case AL_BUFFERS_QUEUED:
        CHECKSIZE(values, 1);
        if(BufferlistItem *BufferList{Source->queue})
        {
            ALsizei count{0};
            do {
                ++count;
                BufferList = BufferList->mNext.load(std::memory_order_relaxed);
            } while(BufferList != nullptr);
            values[0] = count;
        }
        else
            values[0] = 0;
        return true;

    case AL_BUFFERS_PROCESSED:
        CHECKSIZE(values, 1);
        if(Source->Looping || Source->SourceType != AL_STREAMING)
        {
            /* Buffers on a looping source are in a perpetual state of PENDING,
             * so don't report any as PROCESSED
             */
            values[0] = 0;
        }
        else
        {
            const BufferlistItem *BufferList{Source->queue};
            const BufferlistItem *Current{nullptr};
            ALsizei played{0};

            Voice *voice{GetSourceVoice(Source, Context)};
            if(voice != nullptr)
                Current = voice->mCurrentBuffer.load(std::memory_order_relaxed);
            else if(Source->state == AL_INITIAL)
                Current = BufferList;

            while(BufferList && BufferList != Current)
            {
                ++played;
                BufferList = BufferList->mNext.load(std::memory_order_relaxed);
            }
            values[0] = played;
        }
        return true;

    case AL_SOURCE_TYPE:
        CHECKSIZE(values, 1);
        values[0] = Source->SourceType;
        return true;

    case AL_DIRECT_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->DryGainHFAuto;
        return true;

    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->WetGainAuto;
        return true;

    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->WetGainHFAuto;
        return true;

    case AL_DIRECT_CHANNELS_SOFT:
        CHECKSIZE(values, 1);
        values[0] = EnumFromDirectMode(Source->DirectChannels);
        return true;

    case AL_DISTANCE_MODEL:
        CHECKSIZE(values, 1);
        values[0] = static_cast<int>(Source->mDistanceModel);
        return true;

    case AL_SOURCE_RESAMPLER_SOFT:
        CHECKSIZE(values, 1);
        values[0] = static_cast<int>(Source->mResampler);
        return true;

    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        values[0] = EnumFromSpatializeMode(Source->mSpatialize);
        return true;

    /* 1x float/double */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
    case AL_DOPPLER_FACTOR:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 1u})) != false)
            values[0] = static_cast<int>(dvals[0]);
        return err;

    /* 3x float/double */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 3u})) != false)
        {
            values[0] = static_cast<int>(dvals[0]);
            values[1] = static_cast<int>(dvals[1]);
            values[2] = static_cast<int>(dvals[2]);
        }
        return err;

    /* 6x float/double */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 6u})) != false)
        {
            values[0] = static_cast<int>(dvals[0]);
            values[1] = static_cast<int>(dvals[1]);
            values[2] = static_cast<int>(dvals[2]);
            values[3] = static_cast<int>(dvals[3]);
            values[4] = static_cast<int>(dvals[4]);
            values[5] = static_cast<int>(dvals[5]);
        }
        return err;

    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break; /* i64 only */
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
        break; /* Double only */
    case AL_STEREO_ANGLES:
        break; /* Float/double only */

    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
        break; /* ??? */
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer property 0x%04x", prop);
    return false;
}